

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ImplicitAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitAnsiPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::PortHeaderSyntax&,slang::syntax::DeclaratorSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          PortHeaderSyntax *args_1,DeclaratorSyntax *args_2)

{
  ImplicitAnsiPortSyntax *this_00;
  
  this_00 = (ImplicitAnsiPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicitAnsiPortSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ImplicitAnsiPortSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  slang::syntax::ImplicitAnsiPortSyntax::ImplicitAnsiPortSyntax(this_00,args,args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }